

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_block.cpp
# Opt level: O0

DominatorIterator * __thiscall
spvtools::val::BasicBlock::structural_pdom_begin
          (DominatorIterator *__return_storage_ptr__,BasicBlock *this)

{
  anon_class_1_0_00000001 local_39;
  function<const_spvtools::val::BasicBlock_*(const_spvtools::val::BasicBlock_*)> local_38;
  BasicBlock *local_18;
  BasicBlock *this_local;
  
  local_18 = this;
  this_local = (BasicBlock *)__return_storage_ptr__;
  std::function<spvtools::val::BasicBlock_const*(spvtools::val::BasicBlock_const*)>::
  function<spvtools::val::BasicBlock::structural_pdom_begin()const::__0,void>
            ((function<spvtools::val::BasicBlock_const*(spvtools::val::BasicBlock_const*)> *)
             &local_38,&local_39);
  DominatorIterator::DominatorIterator(__return_storage_ptr__,this,&local_38);
  std::function<const_spvtools::val::BasicBlock_*(const_spvtools::val::BasicBlock_*)>::~function
            (&local_38);
  return __return_storage_ptr__;
}

Assistant:

const BasicBlock::DominatorIterator BasicBlock::structural_pdom_begin() const {
  return DominatorIterator(this, [](const BasicBlock* b) {
    return b->immediate_structural_post_dominator();
  });
}